

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O1

void __thiscall
ZXing::Matrix<ZXing::Trit>::Matrix(Matrix<ZXing::Trit> *this,int width,int height,value_t val)

{
  invalid_argument *this_00;
  allocator_type local_2a;
  value_type local_29;
  
  this->_width = width;
  this->_height = height;
  local_29.value = val.value;
  std::vector<ZXing::Trit,_std::allocator<ZXing::Trit>_>::vector
            (&this->_data,(long)(height * width),&local_29,&local_2a);
  if ((width != 0) &&
     ((*(int *)&(this->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
                super__Vector_impl_data._M_finish -
      *(int *)&(this->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
               super__Vector_impl_data._M_start) / width != height)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Invalid size: width * height is too big");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

Matrix(int width, int height, value_t val = {}) : _width(width), _height(height), _data(_width * _height, val) {
		if (width != 0 && Size(_data) / width != height)
			throw std::invalid_argument("Invalid size: width * height is too big");
	}